

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O2

void __thiscall ChUll::ChUll(ChUll *this,ConvexResult *result)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ConvexResult *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  this_00 = (ConvexResult *)::operator_new(0xa8);
  ConvexDecomposition::ConvexResult::ConvexResult(this_00,result);
  *(ConvexResult **)&this->mDiagonal = this_00;
  fVar6 = computeMeshVolume(result->mHullVertices,result->mHullTcount,result->mHullIndices);
  this->mMax[2] = (HaF32)fVar6;
  fVar6 = getBoundingRegion(result->mHullVcount,result->mHullVertices,0xc,(float *)this,
                            (float *)(this->mMin + 2));
  this->mVolume = (HaF32)fVar6;
  auVar3._0_4_ = this->mGuid;
  auVar3._4_4_ = this->mMin[0];
  auVar3._8_4_ = this->mMin[1];
  auVar3._12_4_ = this->mMin[2];
  uVar1 = *(ulong *)this->mMax;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1;
  fVar6 = ((float)this->mMin[2] - (float)auVar3._0_4_) * 0.1;
  auVar5 = vshufps_avx(auVar3,auVar3,0xe9);
  auVar5 = vsubps_avx(auVar9,auVar5);
  auVar4._8_4_ = 0x3dcccccd;
  auVar4._0_8_ = 0x3dcccccd3dcccccd;
  auVar4._12_4_ = 0x3dcccccd;
  auVar4 = vmulps_avx512vl(auVar5,auVar4);
  auVar5._4_4_ = fVar6;
  auVar5._0_4_ = fVar6;
  auVar5._8_4_ = fVar6;
  auVar5._12_4_ = fVar6;
  auVar5 = vpermi2ps_avx512vl(_DAT_00f48910,auVar4,auVar5);
  auVar5 = vsubps_avx(auVar3,auVar5);
  auVar7._0_4_ = (float)auVar3._0_4_ + fVar6;
  auVar7._4_4_ = (float)auVar3._4_4_ + fVar6;
  auVar7._8_4_ = (float)auVar3._8_4_ + fVar6;
  auVar7._12_4_ = (float)auVar3._12_4_ + fVar6;
  auVar8._0_4_ = (float)uVar1 + auVar4._0_4_;
  auVar8._4_4_ = (float)(uVar1 >> 0x20) + auVar4._4_4_;
  auVar8._8_4_ = auVar4._8_4_ + 0.0;
  auVar8._12_4_ = auVar4._12_4_ + 0.0;
  auVar3 = vblendps_avx(auVar5,auVar7,8);
  this->mGuid = auVar3._0_4_;
  this->mMin[0] = (HaF32)auVar3._4_4_;
  this->mMin[1] = (HaF32)auVar3._8_4_;
  this->mMin[2] = (HaF32)auVar3._12_4_;
  uVar2 = vmovlps_avx(auVar8);
  *(undefined8 *)this->mMax = uVar2;
  return;
}

Assistant:

ChUll::ChUll(const ConvexResult &result)
{
	mResult = new ConvexResult(result);
	mVolume = computeMeshVolume( result.mHullVertices, result.mHullTcount, result.mHullIndices );

	mDiagonal = getBoundingRegion( result.mHullVcount, result.mHullVertices, sizeof(float)*3, mMin, mMax );

	float dx = mMax[0] - mMin[0];
	float dy = mMax[1] - mMin[1];
	float dz = mMax[2] - mMin[2];

	dx*=0.1f; // inflate 1/10th on each edge
	dy*=0.1f; // inflate 1/10th on each edge
	dz*=0.1f; // inflate 1/10th on each edge

	mMin[0]-=dx;
	mMin[1]-=dy;
	mMin[2]-=dz;

	mMax[0]+=dx;
	mMax[1]+=dy;
	mMax[2]+=dz;


}